

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool ClipperLib::SlopesEqual(TEdge *e1,TEdge *e2,bool UseFullInt64Range)

{
  undefined7 in_register_00000011;
  bool bVar1;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  if ((int)CONCAT71(in_register_00000011,UseFullInt64Range) == 0) {
    bVar1 = ((e2->Top).X - (e2->Bot).X) * ((e1->Top).Y - (e1->Bot).Y) -
            ((e2->Top).Y - (e2->Bot).Y) * ((e1->Top).X - (e1->Bot).X) == 0;
  }
  else {
    Int128Mul((ClipperLib *)&local_28,(e1->Top).Y - (e1->Bot).Y,(e2->Top).X - (e2->Bot).X);
    Int128Mul((ClipperLib *)&local_38,(e1->Top).X - (e1->Bot).X,(e2->Top).Y - (e2->Bot).Y);
    bVar1 = local_38 == local_28 && local_20 == local_30;
  }
  return bVar1;
}

Assistant:

bool SlopesEqual(const TEdge &e1, const TEdge &e2, bool UseFullInt64Range)
{
#ifndef use_int32
  if (UseFullInt64Range)
    return Int128Mul(e1.Top.Y - e1.Bot.Y, e2.Top.X - e2.Bot.X) == 
    Int128Mul(e1.Top.X - e1.Bot.X, e2.Top.Y - e2.Bot.Y);
  else 
#endif
    return (e1.Top.Y - e1.Bot.Y) * (e2.Top.X - e2.Bot.X) == 
    (e1.Top.X - e1.Bot.X) * (e2.Top.Y - e2.Bot.Y);
}